

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_32f1a0::DotSuffix::printLeft(DotSuffix *this,OutputStream *s)

{
  StringView local_48;
  char *local_38;
  char *local_30;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *s_local;
  DotSuffix *this_local;
  
  local_18 = s;
  s_local = (OutputStream *)this;
  Node::print(this->Prefix,s);
  StringView::StringView(&local_28," (");
  OutputStream::operator+=(local_18,local_28);
  local_38 = (this->Suffix).First;
  local_30 = (this->Suffix).Last;
  OutputStream::operator+=(local_18,this->Suffix);
  StringView::StringView(&local_48,")");
  OutputStream::operator+=(local_18,local_48);
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    Prefix->print(s);
    s += " (";
    s += Suffix;
    s += ")";
  }